

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep_io.c
# Opt level: O0

int sprkStep_WriteParameters(ARKodeMem ark_mem,FILE *fp)

{
  ARKodeMem in_RSI;
  int retval;
  ARKodeSPRKStepMem step_mem;
  uint in_stack_ffffffffffffffd8;
  long *plVar1;
  int local_4;
  
  plVar1 = (long *)0x0;
  local_4 = sprkStep_AccessStepMem
                      (in_RSI,(char *)0x0,(ARKodeSPRKStepMem *)(ulong)in_stack_ffffffffffffffd8);
  if (local_4 == 0) {
    fprintf((FILE *)in_RSI,"SPRKStep time step module parameters:\n");
    fprintf((FILE *)in_RSI,"  Method order %i\n",(ulong)*(uint *)*plVar1);
    fprintf((FILE *)in_RSI,"  Method stages %i\n",(ulong)*(uint *)(*plVar1 + 4));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int sprkStep_WriteParameters(ARKodeMem ark_mem, FILE* fp)
{
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* print integrator parameters to file */
  fprintf(fp, "SPRKStep time step module parameters:\n");
  fprintf(fp, "  Method order %i\n", step_mem->method->q);
  fprintf(fp, "  Method stages %i\n", step_mem->method->stages);

  return (ARK_SUCCESS);
}